

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O1

string * __thiscall
bf_crc::feed_type_to_str_abi_cxx11_(string *__return_storage_ptr__,bf_crc *this,FEED_TYPE feed_type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(feed_type) {
  case AUTO:
    pcVar2 = "auto";
    pcVar1 = "";
    break;
  case LINEAR_FORWARD:
    pcVar2 = "linear-forward";
    pcVar1 = "";
    break;
  case LINEAR_REVERSED:
    pcVar2 = "linear-reversed";
    pcVar1 = "";
    break;
  case BYTEWISE_REVERSED:
    pcVar2 = "bytewise-reversed";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "undefined";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string bf_crc::feed_type_to_str(my_crc_basic::FEED_TYPE feed_type) { 
  switch(feed_type) {
  case my_crc_basic::AUTO: return "auto";
  case my_crc_basic::LINEAR_FORWARD: return "linear-forward";
  case my_crc_basic::LINEAR_REVERSED: return "linear-reversed";
  case my_crc_basic::BYTEWISE_REVERSED: return "bytewise-reversed";
  default: return "undefined";
  }
}